

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O3

void WjTestLib_AddTest(WJTL_UNIT_TEST_FUNCTION TestFunction,char *TestName)

{
  WJTL_STATUS WVar1;
  WjtlTestList *pWVar2;
  char *pcVar3;
  WjtlTestList *pWVar4;
  WJTL_UNIT_TEST_FUNCTION unaff_RBX;
  WjtlGroupList *pWVar5;
  long lVar6;
  WjtlGroupList *unaff_R12;
  bool bVar7;
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t auStack_70 [3];
  WJTL_UNIT_TEST_FUNCTION p_Stack_58;
  WjtlGroupList *pWStack_50;
  
  if ((TestFunction == (WJTL_UNIT_TEST_FUNCTION)0x0) || (TestName == (char *)0x0)) {
    WjTestLib_AddTest_cold_1();
LAB_0011dbb2:
    WjTestLib_AddTest_cold_3();
  }
  else {
    unaff_RBX = TestFunction;
    if ((gGroupListTail == (WjtlGroupList *)0x0) &&
       (WjTestLib_NewGroup("Default"), unaff_R12 = gGroupListTail,
       gGroupListTail == (WjtlGroupList *)0x0)) goto LAB_0011dbbc;
    unaff_R12 = gGroupListTail;
    pWVar2 = (WjtlTestList *)calloc(1,0x50);
    if (pWVar2 == (WjtlTestList *)0x0) goto LAB_0011dbb2;
    pcVar3 = strdup(TestName);
    pWVar2->TestName = pcVar3;
    if (pcVar3 != (char *)0x0) {
      pWVar2->TestFunction = TestFunction;
      pWVar4 = (WjtlTestList *)&unaff_R12->TestListHead;
      if (unaff_R12->TestListTail != (WjtlTestList *)0x0) {
        pWVar4 = unaff_R12->TestListTail;
      }
      pWVar4->Next = pWVar2;
      unaff_R12->TestListTail = pWVar2;
      return;
    }
  }
  WjTestLib_AddTest_cold_2();
LAB_0011dbbc:
  WjTestLib_AddTest_cold_4();
  p_Stack_58 = unaff_RBX;
  pWStack_50 = unaff_R12;
  if (gGroupListHead == (WjtlGroupList *)0x0) {
    pcVar3 = "No group named: %s\n";
LAB_0011dd2d:
    printf(pcVar3,0);
  }
  else {
    bVar7 = false;
    pWVar5 = gGroupListHead;
    do {
      while( true ) {
        printf(":::::::: Test Group : %s ::::::::\n",pWVar5->GroupName);
        pWVar2 = pWVar5->TestListHead;
        if (pWVar2 != (WjtlTestList *)0x0) break;
        pWVar5 = pWVar5->Next;
        if (pWVar5 == (WjtlGroupList *)0x0) {
          if (bVar7) {
            return;
          }
          pcVar3 = "No test named: %s\n";
          goto LAB_0011dd2d;
        }
      }
      do {
        printf(":::: Test : %s ::::\n",pWVar2->TestName);
        auStack_70[0] = 0;
        auStack_70[2] = 0;
        uStack_78 = 0;
        uStack_80 = 0;
        auStack_70[1] = 0;
        uStack_88 = 0;
        uStack_90 = 0;
        uStack_98 = 0;
        WjTestLib_Memory_GetStats(auStack_70,auStack_70 + 2,&uStack_78);
        WjTestLib_Asserts_Reset();
        WVar1 = (*pWVar2->TestFunction)();
        WjTestLib_Memory_GetStats(&uStack_80,auStack_70 + 1,&uStack_88);
        WjTestLib_Asserts_GetStats(&uStack_90,&uStack_98);
        pWVar2->TestStatus = WVar1;
        pWVar2->NumAsserts = uStack_90;
        pWVar2->NumFailedAsserts = uStack_98;
        if (uStack_98 != 0) {
          printf("#### %lu Assert fails in test: %s\n",uStack_98,pWVar2->TestName);
        }
        pWVar2->NumAllocations = uStack_80 - auStack_70[0];
        lVar6 = uStack_88 - uStack_78;
        pWVar2->NumMemLeaks = lVar6;
        if (lVar6 != 0) {
          printf("#### %lu Memory leaks in test: %s\n",lVar6,pWVar2->TestName);
        }
        pWVar5->GroupRun = true;
        pWVar2->TestRun = true;
        pWVar2 = pWVar2->Next;
      } while (pWVar2 != (WjtlTestList *)0x0);
      pWVar5 = pWVar5->Next;
      bVar7 = true;
    } while (pWVar5 != (WjtlGroupList *)0x0);
  }
  return;
}

Assistant:

void
    WjTestLib_AddTest
    (
        WJTL_UNIT_TEST_FUNCTION     TestFunction,
        char const*                 TestName
    )
{
    if(     NULL != TestFunction
        &&  NULL != TestName )
    {
        if( NULL == gGroupListTail )
        {
            // No group created yet, so make a default one
            WjTestLib_NewGroup( "Default" );
        }

        if( NULL != gGroupListTail )
        {
            WjtlTestList* newTest = calloc( 1, sizeof(WjtlTestList) );
            if( NULL != newTest )
            {
                newTest->TestName = strdup( TestName );
                if( NULL != newTest->TestName )
                {
                    newTest->NumAllocations = 0;
                    newTest->NumDeallocations = 0;
                    newTest->NumAsserts = 0;
                    newTest->NumFailedAsserts = 0;
                    newTest->TestFunction = TestFunction;
                    newTest->Next = NULL;

                    if( NULL == gGroupListTail->TestListTail )
                    {
                        gGroupListTail->TestListHead = newTest;
                    }
                    else
                    {
                        gGroupListTail->TestListTail->Next = newTest;
                    }
                    gGroupListTail->TestListTail = newTest;
                }
                else
                {
                    InternalError( "Memory fail" );
                }
            }
            else
            {
                InternalError( "Memory fail" );
            }
        }
        else
        {
            InternalError( "Failed to create default group" );
        }
    }
    else
    {
        InternalError( "Invalid parameters" );
    }
}